

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O1

void QUnicodeTools::Tailored::tibetanAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  
  if (0 < len) {
    lVar4 = 0;
    do {
      lVar5 = 1;
      if (((ushort)(text[from + lVar4] + L'\xf0c0') < 0x80) &&
         (((ushort)text[from + lVar4] - 0xf40 & 0xfffffffc) < 0x2c)) {
        uVar3 = 1;
        do {
          if (len - lVar4 <= lVar5) break;
          uVar7 = 0;
          if ((ushort)(text[from + lVar4 + lVar5] + L'\xf0c0') < 0x80) {
            uVar7 = (uint)(byte)tibetanForm[(ushort)text[from + lVar4 + lVar5] - 0xf40];
          }
          if (uVar7 < 2) {
LAB_00346016:
            bVar1 = false;
          }
          else {
            if (uVar7 - 2 < 2) {
              uVar2 = uVar7;
              if (uVar3 - 3 < 0xfffffffe) goto LAB_00346016;
            }
            else {
              uVar2 = uVar3;
              if ((uVar7 == 4) && (uVar3 - 4 < 0xfffffffd)) goto LAB_00346016;
            }
            uVar3 = uVar2;
            lVar5 = lVar5 + 1;
            bVar1 = true;
          }
        } while (bVar1);
      }
      attributes[lVar4 + from] = (QCharAttributes)((byte)attributes[lVar4 + from] | 1);
      lVar6 = lVar5 + lVar4;
      if (len <= lVar5 + lVar4) {
        lVar6 = len;
      }
      lVar4 = lVar4 + 1;
      if (lVar4 < lVar6) {
        do {
          attributes[lVar4 + from] = (QCharAttributes)((byte)attributes[lVar4 + from] & 0xfe);
          lVar4 = lVar4 + 1;
        } while (lVar6 != lVar4);
      }
    } while (lVar4 < len);
  }
  return;
}

Assistant:

static void tibetanAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    qsizetype i = 0;
    Q_UNUSED(script);
    attributes += from;
    while (i < len) {
        bool invalid;
        qsizetype boundary = tibetan_nextSyllableBoundary(text, from+i, end, &invalid) - from;

        attributes[i].graphemeBoundary = true;

        if (boundary > len-1) boundary = len;
        i++;
        while (i < boundary) {
            attributes[i].graphemeBoundary = false;
            ++i;
        }
        assert(i == boundary);
    }
}